

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDebugMarkerTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_0::InvalidCase::iterate(InvalidCase *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *this_01;
  MessageBuilder local_198;
  long local_18;
  Functions *gl;
  InvalidCase *this_local;
  
  gl = (Functions *)this;
  pRVar2 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar1);
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<
                      (&local_198,
                       (char (*) [97])
                       "Note: GL_EXT_debug_marker calls must not report an error even if invalid arguments are supplied."
                      );
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  (**(code **)(local_18 + 0x1208))(0xffffffff,"foo");
  (**(code **)(local_18 + 0xc20))(0xffffffff,"foo");
  (**(code **)(local_18 + 0x1208))(0,0);
  (**(code **)(local_18 + 0xc20))(0,0);
  (**(code **)(local_18 + 0x1208))(0xffffffff,0);
  (**(code **)(local_18 + 0xc20))(0xffffffff,0);
  err = (**(code **)(local_18 + 0x800))();
  glu::checkError(err,"Debug marker calls must not set error state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDebugMarkerTests.cpp"
                  ,0xbb);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "All calls passed");
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();

		m_testCtx.getLog() << TestLog::Message << "Note: GL_EXT_debug_marker calls must not report an error even if invalid arguments are supplied." << TestLog::EndMessage;

		gl.pushGroupMarkerEXT(-1, "foo");
		gl.insertEventMarkerEXT(-1, "foo");
		gl.pushGroupMarkerEXT(0, DE_NULL);
		gl.insertEventMarkerEXT(0, DE_NULL);
		gl.pushGroupMarkerEXT(-1, DE_NULL);
		gl.insertEventMarkerEXT(-1, DE_NULL);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Debug marker calls must not set error state");

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "All calls passed");
		return STOP;
	}